

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O2

Ptr<Image> __thiscall
myvk::Image::Create(Image *this,Ptr<Device> *device,VkImageCreateInfo *create_info,
                   VmaAllocationCreateFlags allocation_flags,VmaMemoryUsage memory_usage,
                   vector<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
                   *access_queues)

{
  _Rb_tree_header *__last;
  pointer psVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  VkFormat VVar4;
  undefined4 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  VkResult VVar7;
  long lVar8;
  ulong uVar9;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<myvk::Queue> *i;
  pointer psVar10;
  VkImageCreateInfo *pVVar11;
  byte bVar12;
  Ptr<Image> PVar13;
  shared_ptr<myvk::Image> ret;
  vector<unsigned_int,_std::allocator<unsigned_int>_> queue_families;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> queue_family_set;
  VkImageCreateInfo local_b8;
  VmaAllocationCreateInfo local_60;
  
  bVar12 = 0;
  std::make_shared<myvk::Image>();
  std::__shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              m_device_ptr).super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>,
             &device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>);
  ((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase).
  m_usage = create_info->usage;
  uVar2 = (create_info->extent).height;
  ((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase).
  m_extent.width = (create_info->extent).width;
  ((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase).
  m_extent.height = uVar2;
  ((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase).
  m_extent.depth = (create_info->extent).depth;
  VVar4 = create_info->format;
  uVar2 = create_info->mipLevels;
  uVar3 = create_info->arrayLayers;
  ((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase).m_type
       = create_info->imageType;
  ((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase).
  m_format = VVar4;
  ((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase).
  m_mip_levels = uVar2;
  ((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_ImageBase).
  m_array_layers = uVar3;
  __last = &queue_family_set._M_t._M_impl.super__Rb_tree_header;
  queue_family_set._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  queue_family_set._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  queue_family_set._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  psVar1 = (access_queues->
           super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  psVar10 = (access_queues->
            super__Vector_base<std::shared_ptr<myvk::Queue>,_std::allocator<std::shared_ptr<myvk::Queue>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  queue_family_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &__last->_M_header;
  queue_family_set._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &__last->_M_header;
  for (; psVar10 != psVar1; psVar10 = psVar10 + 1) {
    local_b8.sType =
         ((((psVar10->super___shared_ptr<myvk::Queue,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
          m_unique_queue_ptr).super___shared_ptr<myvk::UniqueQueue,_(__gnu_cxx::_Lock_policy)2>.
         _M_ptr)->m_family_index;
    std::
    _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
    ::_M_insert_unique<unsigned_int>(&queue_family_set._M_t,&local_b8.sType);
  }
  std::vector<unsigned_int,std::allocator<unsigned_int>>::
  vector<std::_Rb_tree_const_iterator<unsigned_int>,void>
            ((vector<unsigned_int,std::allocator<unsigned_int>> *)&queue_families,
             (_Rb_tree_const_iterator<unsigned_int>)
             queue_family_set._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
             (_Rb_tree_const_iterator<unsigned_int>)__last,(allocator_type *)&local_b8);
  pVVar11 = &local_b8;
  for (lVar8 = 0xb; lVar8 != 0; lVar8 = lVar8 + -1) {
    uVar5 = *(undefined4 *)&create_info->field_0x4;
    pVVar11->sType = create_info->sType;
    *(undefined4 *)&pVVar11->field_0x4 = uVar5;
    create_info = (VkImageCreateInfo *)((long)create_info + (ulong)bVar12 * -0x10 + 8);
    pVVar11 = (VkImageCreateInfo *)((long)pVVar11 + ((ulong)bVar12 * -2 + 1) * 8);
  }
  uVar9 = (long)queue_families.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)queue_families.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                _M_impl.super__Vector_impl_data._M_start >> 2;
  if (1 < uVar9) {
    local_b8.queueFamilyIndexCount = (uint32_t)uVar9;
    local_b8.pQueueFamilyIndices =
         queue_families.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_b8.sharingMode = (VkSharingMode)(1 < uVar9);
  local_60.pool = (VmaPool)0x0;
  local_60.pUserData = (void *)0x0;
  local_60.priority = 0.0;
  local_60._44_4_ = 0;
  local_60.requiredFlags = 0;
  local_60.preferredFlags = 0;
  local_60.memoryTypeBits = 0;
  local_60._20_4_ = 0;
  local_60.flags = allocation_flags;
  local_60.usage = memory_usage;
  VVar7 = vmaCreateImage(((device->super___shared_ptr<myvk::Device,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr)->m_allocator,&local_b8,&local_60,
                         &((ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                          ->super_ImageBase).m_image,
                         &(ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          m_allocation,(VmaAllocationInfo *)0x0);
  _Var6 = ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  if (VVar7 == VK_SUCCESS) {
    ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (this->super_ImageBase).super_DeviceObjectBase.super_Base._vptr_Base =
         (_func_int **)ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_ImageBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)_Var6._M_pi;
    ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  else {
    (this->super_ImageBase).super_DeviceObjectBase.super_Base._vptr_Base = (_func_int **)0x0;
    (this->super_ImageBase).super_DeviceObjectBase.super_Base.
    super_enable_shared_from_this<myvk::Base>._M_weak_this.
    super___weak_ptr<myvk::Base,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&queue_families.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&queue_family_set._M_t);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&ret.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  PVar13.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar13.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr<Image>)PVar13.super___shared_ptr<myvk::Image,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ptr<Image> Image::Create(const Ptr<Device> &device, const VkImageCreateInfo &create_info,
                         VmaAllocationCreateFlags allocation_flags, VmaMemoryUsage memory_usage,
                         const std::vector<Ptr<Queue>> &access_queues) {
	auto ret = std::make_shared<Image>();
	ret->m_device_ptr = device;

	ret->m_usage = create_info.usage;
	ret->m_extent = create_info.extent;
	ret->m_type = create_info.imageType;
	ret->m_format = create_info.format;
	ret->m_mip_levels = create_info.mipLevels;
	ret->m_array_layers = create_info.arrayLayers;

	std::set<uint32_t> queue_family_set;
	for (auto &i : access_queues)
		queue_family_set.insert(i->GetFamilyIndex());
	std::vector<uint32_t> queue_families{queue_family_set.begin(), queue_family_set.end()};

	VkImageCreateInfo new_info{create_info};
	if (queue_families.size() <= 1) {
		new_info.sharingMode = VK_SHARING_MODE_EXCLUSIVE;
	} else {
		new_info.sharingMode = VK_SHARING_MODE_CONCURRENT;
		new_info.queueFamilyIndexCount = queue_families.size();
		new_info.pQueueFamilyIndices = queue_families.data();
	}

	VmaAllocationCreateInfo alloc_info = {};
	alloc_info.flags = allocation_flags;
	alloc_info.usage = memory_usage;

	if (vmaCreateImage(device->GetAllocatorHandle(), &new_info, &alloc_info, &ret->m_image, &ret->m_allocation,
	                   nullptr) != VK_SUCCESS)
		return nullptr;
	return ret;
}